

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::CompilerGLSL::get_integer_width_for_glsl_instruction
          (CompilerGLSL *this,GLSLstd450 op,uint32_t *ops,uint32_t length)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  
  uVar1 = 0x20;
  if ((length != 0) &&
     (((op < GLSLstd450FMix && ((0x36c0000000a0U >> ((ulong)op & 0x3f) & 1) != 0)) ||
      (op - GLSLstd450FindSMsb < 2)))) {
    pSVar2 = Compiler::expression_type(&this->super_Compiler,*ops);
    uVar1 = pSVar2->width;
  }
  return uVar1;
}

Assistant:

uint32_t CompilerGLSL::get_integer_width_for_glsl_instruction(GLSLstd450 op, const uint32_t *ops, uint32_t length) const
{
	if (length < 1)
		return 32;

	switch (op)
	{
	case GLSLstd450SAbs:
	case GLSLstd450SSign:
	case GLSLstd450UMin:
	case GLSLstd450SMin:
	case GLSLstd450UMax:
	case GLSLstd450SMax:
	case GLSLstd450UClamp:
	case GLSLstd450SClamp:
	case GLSLstd450FindSMsb:
	case GLSLstd450FindUMsb:
		return expression_type(ops[0]).width;

	default:
	{
		// We don't need to care about other opcodes, just return 32.
		return 32;
	}
	}
}